

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  long lVar2;
  pointer pbVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_18f;
  allocator local_18e;
  allocator local_18d;
  allocator local_18c;
  allocator local_18b;
  allocator local_18a;
  allocator local_189;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  std::__cxx11::string::string((string *)&local_130,"1-normal",(allocator *)&local_150);
  std::__cxx11::string::string(local_110,"2-noisy",(allocator *)&local_170);
  std::__cxx11::string::string(local_f0,"3-blurry",&local_189);
  std::__cxx11::string::string(local_d0,"4-collapsed",&local_18a);
  std::__cxx11::string::string(local_b0,"5-blurry_noisy",&local_18b);
  std::__cxx11::string::string(local_90,"6-collapsed_noisy",&local_18c);
  std::__cxx11::string::string(local_70,"7-collapsed_blurry",&local_18d);
  std::__cxx11::string::string(local_50,"8-collapsed_blurry_noisy",&local_18e);
  __l._M_len = 8;
  __l._M_array = &local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&files,__l,&local_18f);
  lVar2 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_130._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x20);
  for (pbVar3 = files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    std::__cxx11::string::string((string *)&local_170,(string *)pbVar3);
    poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_170);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator+(&local_150,&local_170,".jpg");
    cv::imread((string *)&local_130,(int)&local_150);
    processImage((Mat *)&local_130,*local_170._M_dataplus._M_p);
    cv::Mat::~Mat((Mat *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&files);
  return 0;
}

Assistant:

int main() {
    vector<string> files{"1-normal", "2-noisy", "3-blurry", "4-collapsed", "5-blurry_noisy", "6-collapsed_noisy", "7-collapsed_blurry", "8-collapsed_blurry_noisy"};
    auto openAndProcess = [](string name) {cout << name <<endl;processImage(imread(name + ".jpg", 0), name[0]);};
    for_each(files.begin(), files.end(), openAndProcess);
}